

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.c
# Opt level: O1

size_t FSE_buildDTable_internal
                 (FSE_DTable *dt,short *normalizedCounter,uint maxSymbolValue,uint tableLog,
                 void *workSpace,size_t wkspSize)

{
  ushort uVar1;
  size_t sVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  undefined2 uVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  U32 s;
  ulong uVar14;
  short sVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  size_t u;
  
  bVar4 = (byte)tableLog;
  uVar18 = 1 << (bVar4 & 0x1f);
  sVar2 = 0xffffffffffffffd2;
  if (maxSymbolValue < 0x100) {
    uVar7 = maxSymbolValue + 1;
    if (((1L << (bVar4 & 0x3f)) + (ulong)uVar7 * 2 + 8 <= wkspSize) &&
       (sVar2 = 0xffffffffffffffd4, tableLog < 0xd)) {
      lVar3 = (long)workSpace + (ulong)maxSymbolValue * 2 + 2;
      uVar11 = uVar18 - 1;
      uVar9 = 1;
      uVar14 = 0;
      uVar6 = uVar11;
      do {
        sVar15 = normalizedCounter[uVar14];
        if (sVar15 == -1) {
          uVar17 = (ulong)uVar6;
          uVar6 = uVar6 - 1;
          *(char *)((long)dt + uVar17 * 4 + 6) = (char)uVar14;
          sVar15 = 1;
        }
        else if ((0x10000 << (bVar4 - 1 & 0x1f)) >> 0x10 <= (int)sVar15) {
          uVar9 = 0;
        }
        *(short *)((long)workSpace + uVar14 * 2) = sVar15;
        uVar14 = uVar14 + 1;
      } while (uVar7 != uVar14);
      *(short *)dt = (short)tableLog;
      *(undefined2 *)((long)dt + 2) = uVar9;
      if (uVar6 == uVar11) {
        iVar12 = (uVar18 >> 3) + (uVar18 >> 1) + 3;
        uVar14 = 1;
        if (1 < uVar7) {
          uVar14 = (ulong)uVar7;
        }
        uVar17 = 0;
        lVar16 = 0;
        lVar10 = 0;
        do {
          uVar13 = (ulong)normalizedCounter[uVar17];
          *(long *)(lVar3 + lVar16) = lVar10;
          if (8 < (long)uVar13) {
            uVar8 = 8;
            do {
              *(long *)((long)workSpace + uVar8 + lVar16 + (ulong)maxSymbolValue * 2 + 2) = lVar10;
              uVar8 = uVar8 + 8;
            } while (uVar8 < uVar13);
          }
          lVar16 = lVar16 + uVar13;
          uVar17 = uVar17 + 1;
          lVar10 = lVar10 + 0x101010101010101;
        } while (uVar17 != uVar14);
        if ((uVar18 & 1) != 0) {
          __assert_fail("tableSize % unroll == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/fse_decompress.c"
                        ,0x7f,
                        "size_t FSE_buildDTable_internal(FSE_DTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
        uVar14 = 0;
        uVar7 = 0;
        do {
          lVar10 = 0;
          uVar6 = uVar7;
          do {
            *(undefined1 *)((long)dt + (ulong)(uVar6 & uVar11) * 4 + 6) =
                 *(undefined1 *)(lVar3 + lVar10);
            lVar10 = lVar10 + 1;
            uVar6 = uVar6 + iVar12;
          } while (lVar10 == 1);
          uVar7 = uVar7 + iVar12 * 2 & uVar11;
          uVar14 = uVar14 + 2;
          lVar3 = lVar3 + 2;
        } while (uVar14 < uVar18);
        if (uVar7 != 0) {
          __assert_fail("position == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/fse_decompress.c"
                        ,0x88,
                        "size_t FSE_buildDTable_internal(FSE_DTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
      }
      else {
        uVar14 = 1;
        if (1 < uVar7) {
          uVar14 = (ulong)uVar7;
        }
        uVar17 = 0;
        uVar7 = 0;
        do {
          sVar15 = normalizedCounter[uVar17];
          if (0 < sVar15) {
            iVar12 = 0;
            do {
              *(char *)((long)dt + (ulong)uVar7 * 4 + 6) = (char)uVar17;
              do {
                uVar7 = uVar7 + (uVar18 >> 3) + (uVar18 >> 1) + 3 & uVar11;
              } while (uVar6 < uVar7);
              iVar12 = iVar12 + 1;
            } while (iVar12 != sVar15);
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar14);
        if (uVar7 != 0) {
          return 0xffffffffffffffff;
        }
      }
      sVar2 = 0;
      lVar3 = 0;
      do {
        uVar14 = (ulong)*(byte *)((long)dt + lVar3 * 4 + 6);
        uVar1 = *(ushort *)((long)workSpace + uVar14 * 2);
        *(ushort *)((long)workSpace + uVar14 * 2) = uVar1 + 1;
        if (uVar1 == 0) {
          __assert_fail("val != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/bits.h"
                        ,0xab,"unsigned int ZSTD_highbit32(U32)");
        }
        iVar12 = 0x1f;
        if (uVar1 != 0) {
          for (; uVar1 >> iVar12 == 0; iVar12 = iVar12 + -1) {
          }
        }
        bVar5 = bVar4 - (char)iVar12;
        *(byte *)((long)dt + lVar3 * 4 + 7) = bVar5;
        *(ushort *)(dt + lVar3 + 1) = (uVar1 << (bVar5 & 0x1f)) - (short)uVar18;
        lVar3 = lVar3 + 1;
      } while (uVar18 != (uint)lVar3);
    }
  }
  return sVar2;
}

Assistant:

static size_t FSE_buildDTable_internal(FSE_DTable* dt, const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog, void* workSpace, size_t wkspSize)
{
    void* const tdPtr = dt+1;   /* because *dt is unsigned, 32-bits aligned on 32-bits */
    FSE_DECODE_TYPE* const tableDecode = (FSE_DECODE_TYPE*) (tdPtr);
    U16* symbolNext = (U16*)workSpace;
    BYTE* spread = (BYTE*)(symbolNext + maxSymbolValue + 1);

    U32 const maxSV1 = maxSymbolValue + 1;
    U32 const tableSize = 1 << tableLog;
    U32 highThreshold = tableSize-1;

    /* Sanity Checks */
    if (FSE_BUILD_DTABLE_WKSP_SIZE(tableLog, maxSymbolValue) > wkspSize) return ERROR(maxSymbolValue_tooLarge);
    if (maxSymbolValue > FSE_MAX_SYMBOL_VALUE) return ERROR(maxSymbolValue_tooLarge);
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);

    /* Init, lay down lowprob symbols */
    {   FSE_DTableHeader DTableH;
        DTableH.tableLog = (U16)tableLog;
        DTableH.fastMode = 1;
        {   S16 const largeLimit= (S16)(1 << (tableLog-1));
            U32 s;
            for (s=0; s<maxSV1; s++) {
                if (normalizedCounter[s]==-1) {
                    tableDecode[highThreshold--].symbol = (FSE_FUNCTION_TYPE)s;
                    symbolNext[s] = 1;
                } else {
                    if (normalizedCounter[s] >= largeLimit) DTableH.fastMode=0;
                    symbolNext[s] = normalizedCounter[s];
        }   }   }
        ZSTD_memcpy(dt, &DTableH, sizeof(DTableH));
    }

    /* Spread symbols */
    if (highThreshold == tableSize - 1) {
        size_t const tableMask = tableSize-1;
        size_t const step = FSE_TABLESTEP(tableSize);
        /* First lay down the symbols in order.
         * We use a uint64_t to lay down 8 bytes at a time. This reduces branch
         * misses since small blocks generally have small table logs, so nearly
         * all symbols have counts <= 8. We ensure we have 8 bytes at the end of
         * our buffer to handle the over-write.
         */
        {
            U64 const add = 0x0101010101010101ull;
            size_t pos = 0;
            U64 sv = 0;
            U32 s;
            for (s=0; s<maxSV1; ++s, sv += add) {
                int i;
                int const n = normalizedCounter[s];
                MEM_write64(spread + pos, sv);
                for (i = 8; i < n; i += 8) {
                    MEM_write64(spread + pos + i, sv);
                }
                pos += n;
            }
        }
        /* Now we spread those positions across the table.
         * The benefit of doing it in two stages is that we avoid the
         * variable size inner loop, which caused lots of branch misses.
         * Now we can run through all the positions without any branch misses.
         * We unroll the loop twice, since that is what empirically worked best.
         */
        {
            size_t position = 0;
            size_t s;
            size_t const unroll = 2;
            assert(tableSize % unroll == 0); /* FSE_MIN_TABLELOG is 5 */
            for (s = 0; s < (size_t)tableSize; s += unroll) {
                size_t u;
                for (u = 0; u < unroll; ++u) {
                    size_t const uPosition = (position + (u * step)) & tableMask;
                    tableDecode[uPosition].symbol = spread[s + u];
                }
                position = (position + (unroll * step)) & tableMask;
            }
            assert(position == 0);
        }
    } else {
        U32 const tableMask = tableSize-1;
        U32 const step = FSE_TABLESTEP(tableSize);
        U32 s, position = 0;
        for (s=0; s<maxSV1; s++) {
            int i;
            for (i=0; i<normalizedCounter[s]; i++) {
                tableDecode[position].symbol = (FSE_FUNCTION_TYPE)s;
                position = (position + step) & tableMask;
                while (position > highThreshold) position = (position + step) & tableMask;   /* lowprob area */
        }   }
        if (position!=0) return ERROR(GENERIC);   /* position must reach all cells once, otherwise normalizedCounter is incorrect */
    }

    /* Build Decoding table */
    {   U32 u;
        for (u=0; u<tableSize; u++) {
            FSE_FUNCTION_TYPE const symbol = (FSE_FUNCTION_TYPE)(tableDecode[u].symbol);
            U32 const nextState = symbolNext[symbol]++;
            tableDecode[u].nbBits = (BYTE) (tableLog - ZSTD_highbit32(nextState) );
            tableDecode[u].newState = (U16) ( (nextState << tableDecode[u].nbBits) - tableSize);
    }   }

    return 0;
}